

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fifteen.cpp
# Opt level: O2

void __thiscall Fifteen::slotRemoveGraphic(Fifteen *this)

{
  bool bVar1;
  
  bVar1 = Controller::removeGraphic
                    ((this->controller)._M_t.
                     super___uniq_ptr_impl<Controller,_std::default_delete<Controller>_>._M_t.
                     super__Tuple_impl<0UL,_Controller_*,_std::default_delete<Controller>_>.
                     super__Head_base<0UL,_Controller_*,_false>._M_head_impl);
  if (bVar1) {
    redrawTiles(this);
  }
  MenuBar::setActionMenuState
            ((this->menuBar)._M_t.super___uniq_ptr_impl<MenuBar,_std::default_delete<MenuBar>_>._M_t
             .super__Tuple_impl<0UL,_MenuBar_*,_std::default_delete<MenuBar>_>.
             super__Head_base<0UL,_MenuBar_*,_false>._M_head_impl,REM_GRAPHIC,false);
  Panel::setBoardMode((this->panel)._M_t.super___uniq_ptr_impl<Panel,_std::default_delete<Panel>_>.
                      _M_t.super__Tuple_impl<0UL,_Panel_*,_std::default_delete<Panel>_>.
                      super__Head_base<0UL,_Panel_*,_false>._M_head_impl,NUMERIC);
  return;
}

Assistant:

void Fifteen::slotRemoveGraphic()
{
    if ( controller->removeGraphic() )
    {
        redrawTiles();
    }
    menuBar->setActionMenuState( ActionMenu::REM_GRAPHIC, false );
    panel->setBoardMode( BoardMode::NUMERIC );
}